

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_function.cpp
# Opt level: O0

void duckdb::DecodeLatin1ToUTF8
               (CSVEncoderBuffer *encoded_buffer,char *target_buffer,
               idx_t *target_buffer_current_position,idx_t target_buffer_size,
               char *remaining_bytes_buffer,idx_t *remaining_bytes_size,
               EncodingFunction *encoding_function)

{
  long lVar1;
  string *msg;
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  ulong *in_RDI;
  char *in_R8;
  undefined8 *in_R9;
  uchar ch;
  char *encoded_ptr;
  allocator *this;
  allocator local_61;
  string local_60 [39];
  byte local_39;
  char *local_38;
  undefined8 *local_30;
  char *local_28;
  long local_20;
  long *local_18;
  long local_10;
  ulong *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = CSVEncoderBuffer::Ptr((CSVEncoderBuffer *)0x2a52a9d);
  while( true ) {
    if (local_8[1] <= *local_8) {
      return;
    }
    if (*local_18 == local_20) break;
    local_39 = local_38[*local_8];
    if ((0x7f < local_39) && (local_39 < 0xa0)) {
      msg = (string *)__cxa_allocate_exception(0x10);
      this = &local_61;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_60,"File is not latin-1 encoded",this);
      InvalidInputException::InvalidInputException((InvalidInputException *)this,msg);
      __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
                 );
    }
    if (local_39 < 0x80) {
      lVar1 = *local_18;
      *local_18 = lVar1 + 1;
      *(byte *)(local_10 + lVar1) = local_39;
    }
    else {
      lVar1 = *local_18;
      *local_18 = lVar1 + 1;
      *(char *)(local_10 + lVar1) = (0xbf < local_39) + -0x3e;
      if (*local_18 == local_20) {
        *local_8 = *local_8 + 1;
        *local_28 = (local_39 & 0x3f) + 0x80;
        *local_30 = 1;
        return;
      }
      lVar1 = *local_18;
      *local_18 = lVar1 + 1;
      *(byte *)(local_10 + lVar1) = (local_39 & 0x3f) + 0x80;
    }
    *local_8 = *local_8 + 1;
  }
  return;
}

Assistant:

void DecodeLatin1ToUTF8(CSVEncoderBuffer &encoded_buffer, char *target_buffer, idx_t &target_buffer_current_position,
                        const idx_t target_buffer_size, char *remaining_bytes_buffer, idx_t &remaining_bytes_size,
                        EncodingFunction *encoding_function) {
	auto encoded_ptr = encoded_buffer.Ptr();
	for (; encoded_buffer.cur_pos < encoded_buffer.actual_encoded_buffer_size; encoded_buffer.cur_pos++) {
		if (target_buffer_current_position == target_buffer_size) {
			// We are done
			return;
		}
		const unsigned char ch = static_cast<unsigned char>(encoded_ptr[encoded_buffer.cur_pos]);
		if (ch > 0x7F && ch <= 0x9F) {
			throw InvalidInputException("File is not latin-1 encoded");
		}
		if (ch <= 0x7F) {
			// ASCII: 1 byte in UTF-8
			target_buffer[target_buffer_current_position++] = static_cast<char>(ch);
		} else {
			// Non-ASCII: 2 bytes in UTF-8
			target_buffer[target_buffer_current_position++] = static_cast<char>(0xc2 + (ch > 0xbf));
			if (target_buffer_current_position == target_buffer_size) {
				// We are done, but we have to store one byte for the next chunk!
				encoded_buffer.cur_pos++;
				remaining_bytes_buffer[0] = static_cast<char>((ch & 0x3f) + 0x80);
				remaining_bytes_size = 1;
				return;
			}
			target_buffer[target_buffer_current_position++] = static_cast<char>((ch & 0x3f) + 0x80);
		}
	}
}